

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[40],kj::StringPtr&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<unsigned_long,_unsigned_long> *params,char (*params_1) [40],
          StringPtr *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  char (*params_00) [40];
  StringPtr *params_01;
  long lVar4;
  String argValues [3];
  long *plVar5;
  undefined8 uVar6;
  long local_98 [3];
  String local_80;
  String local_68;
  long local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  this->exception = (Exception *)0x0;
  _::operator*(&local_48,params,CONCAT44(in_register_00000014,line),
               CONCAT44(in_register_0000000c,code));
  local_98[0] = local_48;
  local_98[1] = local_40;
  local_98[2] = uStack_38;
  str<char_const(&)[40]>(&local_80,(kj *)params_1,params_00);
  str<kj::StringPtr&>(&local_68,(kj *)params_2,params_01);
  plVar5 = local_98;
  uVar6 = 3;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x30;
  do {
    lVar1 = *(long *)((long)local_98 + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)local_98 + lVar4 + 8);
      *(undefined8 *)((long)local_98 + lVar4) = 0;
      *(undefined8 *)((long)local_98 + lVar4 + 8) = 0;
      puVar3 = *(undefined8 **)((long)local_98 + lVar4 + 0x10);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,plVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}